

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void * mspace_calloc(mspace msp,size_t n_elements,size_t elem_size)

{
  void *__s;
  mstate ms;
  size_t req;
  void *mem;
  size_t elem_size_local;
  size_t n_elements_local;
  mspace msp_local;
  
  ms = (mstate)0x0;
  if (((n_elements != 0) &&
      (ms = (mstate)(n_elements * elem_size), ((n_elements | elem_size) & 0xffffffffffff0000) != 0))
     && ((ulong)ms / n_elements != elem_size)) {
    ms = (mstate)0xffffffffffffffff;
  }
  __s = mspace_malloc(msp,(size_t)ms);
  if ((__s != (void *)0x0) && ((*(ulong *)((long)__s + -8) & 3) != 0)) {
    memset(__s,0,(size_t)ms);
  }
  return __s;
}

Assistant:

void* mspace_calloc(mspace msp, size_t n_elements, size_t elem_size) {
  void* mem;
  size_t req = 0;
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (n_elements != 0) {
    req = n_elements * elem_size;
    if (((n_elements | elem_size) & ~(size_t)0xffff) &&
        (req / n_elements != elem_size))
      req = MAX_SIZE_T; /* force downstream failure on overflow */
  }
  mem = internal_malloc(ms, req);
  if (mem != 0 && calloc_must_clear(mem2chunk(mem)))
    memset(mem, 0, req);
  return mem;
}